

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O1

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_UploadToBlob
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,char *destinationFileName,uchar *source,
          size_t size)

{
  IOTHUB_CLIENT_RESULT IVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE uploadContext;
  int iVar3;
  _Bool isSuccess;
  char *pcVar4;
  char *azureBlobSasUri;
  char *uploadCorrelationId;
  
  if ((destinationFileName == (char *)0x0 || iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0
      ) || (size != 0 && source == (uchar *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar4 = "NULL";
      if (destinationFileName != (char *)0x0) {
        pcVar4 = destinationFileName;
      }
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_UploadToBlob",0xac2,1,
                "invalid parameters iotHubClientHandle=%p, const char* destinationFileName=%s, const unsigned char* source=%p, size_t size=%lu"
                ,iotHubClientHandle,pcVar4,source,size);
      return IOTHUB_CLIENT_INVALID_ARG;
    }
    return IOTHUB_CLIENT_INVALID_ARG;
  }
  IVar1 = IoTHubClient_LL_UploadToBlob_InitializeUpload
                    (iotHubClientHandle->uploadToBlobHandle,destinationFileName,&uploadCorrelationId
                     ,&azureBlobSasUri);
  if (IVar1 != IOTHUB_CLIENT_OK) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_ERROR;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
              ,"IoTHubClientCore_LL_UploadToBlob",0xacd,1,"Failed initializing upload in IoT Hub");
    return IOTHUB_CLIENT_ERROR;
  }
  uploadContext =
       IoTHubClient_LL_UploadToBlob_CreateContext
                 (iotHubClientHandle->uploadToBlobHandle,azureBlobSasUri);
  if (uploadContext == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      isSuccess = false;
    }
    else {
      isSuccess = false;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_UploadToBlob",0xad7,1,"Failed creating upload to blob context"
               );
    }
    goto LAB_001222c1;
  }
  IVar1 = IoTHubClient_LL_UploadToBlob_PutBlock(uploadContext,0,source,size);
  if (IVar1 == IOTHUB_CLIENT_OK) {
    IVar1 = IoTHubClient_LL_UploadToBlob_PutBlockList(uploadContext);
    if (IVar1 != IOTHUB_CLIENT_OK) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_001222ae;
      pcVar4 = "Failed completing upload to blob.";
      iVar3 = 0xae3;
      goto LAB_001222a1;
    }
    isSuccess = true;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
LAB_001222ae:
      isSuccess = false;
    }
    else {
      pcVar4 = "Failed uploading block to Azure Blob Storage";
      iVar3 = 0xade;
LAB_001222a1:
      isSuccess = false;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_UploadToBlob",iVar3,1,pcVar4);
    }
  }
  IoTHubClient_LL_UploadToBlob_DestroyContext(uploadContext);
LAB_001222c1:
  IVar1 = IoTHubClient_LL_UploadToBlob_NotifyCompletion
                    (iotHubClientHandle->uploadToBlobHandle,uploadCorrelationId,isSuccess,400,
                     (char *)0x0);
  if (IVar1 == IOTHUB_CLIENT_OK) {
    IVar1 = (uint)(isSuccess ^ 1) * 2;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    IVar1 = IOTHUB_CLIENT_ERROR;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_UploadToBlob",0xaf2,1,"Failed completing upload to blob.");
    }
  }
  free(uploadCorrelationId);
  free(azureBlobSasUri);
  return IVar1;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_UploadToBlob(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, const char* destinationFileName, const unsigned char* source, size_t size)
{
    IOTHUB_CLIENT_RESULT result;
    if (
        (iotHubClientHandle == NULL) ||
        (destinationFileName == NULL) ||
        ((source == NULL) && (size >0))
        )
    {
        LogError("invalid parameters iotHubClientHandle=%p, const char* destinationFileName=%s, const unsigned char* source=%p, size_t size=%lu",
            iotHubClientHandle, MU_P_OR_NULL(destinationFileName), source, (unsigned long)size);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        char* uploadCorrelationId;
        char* azureBlobSasUri;

        if (IoTHubClient_LL_UploadToBlob_InitializeUpload(
                iotHubClientHandle->uploadToBlobHandle, destinationFileName, &uploadCorrelationId, &azureBlobSasUri) != IOTHUB_CLIENT_OK)
        {
            LogError("Failed initializing upload in IoT Hub");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            bool uploadSucceeded;
            IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE uploadContext = IoTHubClient_LL_UploadToBlob_CreateContext(iotHubClientHandle->uploadToBlobHandle, azureBlobSasUri);

            if (uploadContext == NULL)
            {
                LogError("Failed creating upload to blob context");
                uploadSucceeded = false;
            }
            else
            {
                if (IoTHubClient_LL_UploadToBlob_PutBlock(uploadContext, 0, source, size) != IOTHUB_CLIENT_OK)
                {
                    LogError("Failed uploading block to Azure Blob Storage");
                    uploadSucceeded = false;
                }
                else if (IoTHubClient_LL_UploadToBlob_PutBlockList(uploadContext) != IOTHUB_CLIENT_OK)
                {
                    LogError("Failed completing upload to blob.");
                    uploadSucceeded = false;
                }
                else
                {
                    uploadSucceeded = true; 
                }

                IoTHubClient_LL_UploadToBlob_DestroyContext(uploadContext);
            }

            // TODO (ewertons): fix the http error status below.
            if (IoTHubClient_LL_UploadToBlob_NotifyCompletion(
                    iotHubClientHandle->uploadToBlobHandle, uploadCorrelationId, uploadSucceeded, 400, NULL) != IOTHUB_CLIENT_OK)
            {
                LogError("Failed completing upload to blob.");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = (uploadSucceeded ? IOTHUB_CLIENT_OK : IOTHUB_CLIENT_ERROR); 
            }

            free(uploadCorrelationId);
            free(azureBlobSasUri);
        }
    }

    return result;
}